

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc-1123_converter.h
# Opt level: O3

bool date::date_converter<date::rfc1123,_long,_void>::from_parts(parts *parts,time_t *timepoint)

{
  undefined1 uVar1;
  undefined1 uVar2;
  year_type yVar3;
  month_type mVar4;
  day_type dVar5;
  undefined8 in_RAX;
  seconds_count sVar6;
  seconds_count sVar7;
  date_time local_28;
  
  local_28._7_1_ = SUB81((ulong)in_RAX >> 0x38,0);
  local_28.super_date.year = 0x7b2;
  local_28.super_date.month = '\x01';
  local_28.super_date.day = '\x01';
  local_28.super_time.hour = '\0';
  local_28.super_time.minute = '\0';
  local_28.super_time.second = '\0';
  sVar6 = calendar_helper::to_seconds_count(&local_28);
  yVar3 = parts->year;
  mVar4 = parts->month;
  dVar5 = parts->day;
  local_28.super_date.day = dVar5;
  local_28.super_date.month = mVar4;
  local_28.super_date.year = yVar3;
  uVar1 = parts->hour;
  uVar2 = parts->minute;
  local_28.super_time.minute = uVar2;
  local_28.super_time.hour = uVar1;
  local_28.super_time.second = parts->second;
  sVar7 = calendar_helper::to_seconds_count(&local_28);
  *timepoint = (sVar7 - sVar6) + (long)parts->offset_in_minutes * -0x3c;
  return true;
}

Assistant:

static bool from_parts(const rfc1123::parts& parts, std::time_t& timepoint)
    {
        using date_time = calendar_helper::date_time;
        const auto epoch_offset = calendar_helper::to_seconds_count(date_time{ 1970, 1, 1, 0, 0, 0 });
        const auto seconds_count = calendar_helper::to_seconds_count(date_time{ parts.year, parts.month, parts.day, parts.hour, parts.minute, parts.second });
        timepoint = static_cast<std::time_t>(seconds_count - parts.offset_in_minutes * 60 - epoch_offset);
        return true;
    }